

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

wchar_t curses_getpos(wchar_t *x,wchar_t *y,nh_bool force,char *goal)

{
  wchar_t wVar1;
  uint uVar2;
  curses_drawing_info *pcVar3;
  bool bVar4;
  int iVar5;
  wchar_t wVar6;
  nh_direction nVar7;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  __int32_t **pp_Var11;
  void *__ptr;
  wchar_t wVar12;
  code *b;
  ulong uVar13;
  wchar_t wVar14;
  short *psVar15;
  short *psVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  char *local_780;
  void *local_778;
  wchar_t my;
  wchar_t mx;
  short *local_768;
  ulong local_760;
  short *local_758;
  wchar_t *local_750;
  wchar_t *local_748;
  short *local_740;
  char printbuf [256];
  nh_desc_buf descbuf;
  
  iVar23 = 0x132fc0;
  werase(statuswin);
  iVar5 = wmove(statuswin,0,0);
  if (iVar5 != -1) {
    waddnstr(statuswin,"Select a target location with the cursor: \'.\' to confirm",
             0xffffffffffffffff);
  }
  pcVar17 = ".";
  if (force == '\0') {
    pcVar17 = ", ESC to cancel.";
  }
  waddnstr(statuswin,pcVar17,0xffffffffffffffff);
  iVar5 = wmove(statuswin,1,0);
  if (iVar5 != -1) {
    waddnstr(statuswin,"Press \'?\' for help and tips.",0xffffffffffffffff);
  }
  wrefresh(statuswin);
  wVar12 = *x;
  if (*x < L'\x01') {
    wVar12 = player.x;
  }
  uVar24 = (ulong)(uint)wVar12;
  wVar6 = *y;
  if (*y < L'\0') {
    wVar6 = player.y;
  }
  uVar25 = (ulong)(uint)wVar6;
  local_750 = x;
  local_748 = y;
  wmove(mapwin,uVar25,wVar12 + L'\xffffffff');
  b = (code *)"(\'?\' for help)";
  if (force == '\0') {
    b = (code *)"(ESC to abort, \'?\' for help)";
  }
  local_778 = (void *)0x0;
  __ptr = (void *)0x0;
  local_780 = "(ESC to abort, \'?\' for help)";
  bVar4 = false;
  local_758 = (short *)b;
  while( true ) {
    wVar12 = (wchar_t)uVar24;
    if (bVar4) {
      mx = L'\0';
      my = L'\0';
      nh_describe_pos(uVar24,uVar25,&descbuf);
      werase(statuswin);
      place_desc_message((WINDOW *)&mx,&my,(wchar_t *)descbuf.effectdesc,(char *)b);
      place_desc_message((WINDOW *)&mx,&my,(wchar_t *)descbuf.invisdesc,(char *)b);
      place_desc_message((WINDOW *)&mx,&my,(wchar_t *)descbuf.mondesc,(char *)b);
      place_desc_message((WINDOW *)&mx,&my,(wchar_t *)descbuf.objdesc,(char *)b);
      place_desc_message((WINDOW *)&mx,&my,(wchar_t *)descbuf.trapdesc,(char *)b);
      place_desc_message((WINDOW *)&mx,&my,(wchar_t *)&descbuf,(char *)b);
      wrefresh(statuswin);
      wmove(mapwin,uVar25,wVar12 + L'\xffffffff');
    }
    wVar6 = get_map_key(L'\0');
    if (wVar6 == L'\x1b') break;
    pvVar10 = memchr(" \r\n.,;:",(int)(char)wVar6,8);
    wVar14 = (wchar_t)uVar25;
    if (pvVar10 != (void *)0x0) {
      wVar6 = curses_getpos::pick_vals[(long)pvVar10 + -0x11a2b0];
LAB_0010c1c4:
      *local_750 = wVar12;
      *local_748 = wVar14;
      free(__ptr);
      free(local_778);
      curses_update_status((nh_player_info *)0x0);
      return wVar6;
    }
    nVar7 = key_to_dir(wVar6);
    if (nVar7 == DIR_NONE) {
      pp_Var11 = __ctype_tolower_loc();
      nVar7 = key_to_dir((*pp_Var11)[(uint)(wVar6 & 0xff)]);
      if (nVar7 == DIR_NONE) {
        uVar8 = 0;
        b = (code *)0x0;
      }
      else {
        b = (code *)(ulong)(uint)(xdir[nVar7] << 3);
        uVar8 = ydir[nVar7] << 3;
      }
    }
    else {
      b = (code *)(ulong)(uint)xdir[nVar7];
      uVar8 = ydir[nVar7];
    }
    pcVar3 = default_drawing;
    iVar5 = (int)b;
    if (iVar5 == 0 && uVar8 == 0) {
      if (wVar6 == L'?') {
        b = (code *)0x0;
        curses_display_menu((nh_menuitem_conflict *)curses_getpos::helpitems,L'\x15',
                            "Targeting Help (default keys)",L'\0',(wchar_t *)0x0);
      }
      else if (wVar6 == L'@') {
        uVar24 = (ulong)(uint)player.x;
        uVar25 = (ulong)(uint)player.y;
      }
      else if ((wVar6 == L'm') || (wVar6 == L'M')) {
        if (__ptr == (void *)0x0) {
          uVar21 = (ulong)(uint)player.x;
          uVar22 = (ulong)(uint)player.y;
          psVar16 = &(*display_buffer)[0].mon;
          iVar23 = 0;
          psVar15 = psVar16;
          for (uVar13 = 0; uVar13 != 0x15; uVar13 = uVar13 + 1) {
            for (lVar18 = 0; lVar18 != 0x780; lVar18 = lVar18 + 0x18) {
              iVar23 = iVar23 + (uint)((uVar21 * 0x18 != lVar18 || uVar13 != uVar22) &&
                                      *(short *)((long)psVar15 + lVar18) != 0);
            }
            psVar15 = psVar15 + 0x3c0;
          }
          __ptr = malloc((long)iVar23 * 8);
          iVar5 = 0;
          for (uVar13 = 0; uVar13 != 0x15; uVar13 = uVar13 + 1) {
            psVar15 = psVar16;
            for (uVar19 = 0; uVar19 != 0x50; uVar19 = uVar19 + 1) {
              if ((*psVar15 != 0) && (uVar21 != uVar19 || uVar13 != uVar22)) {
                *(int *)((long)__ptr + (long)iVar5 * 8) = (int)uVar19;
                *(int *)((long)__ptr + (long)iVar5 * 8 + 4) = (int)uVar13;
                iVar5 = iVar5 + 1;
              }
              psVar15 = psVar15 + 0xc;
            }
            psVar16 = psVar16 + 0x3c0;
          }
          b = compare_coord_dist;
          qsort(__ptr,(long)iVar23,8,compare_coord_dist);
          local_780 = (char *)(ulong)((uint)(wVar6 != L'm') * 2 - 1);
        }
        if (iVar23 == 0) {
          iVar23 = 0;
        }
        else {
          iVar5 = (int)local_780;
          if (wVar6 == L'm') {
            local_780 = (char *)((long)(iVar5 + 1) % (long)iVar23 & 0xffffffff);
          }
          else {
            b = (code *)0x0;
            iVar9 = iVar23;
            if (0 < iVar5) {
              iVar9 = 0;
            }
            local_780 = (char *)(ulong)((iVar5 + iVar9) - 1);
          }
          uVar24 = (ulong)*(uint *)((long)__ptr + (long)(int)local_780 * 8);
          uVar25 = (ulong)*(uint *)((long)__ptr + (long)(int)local_780 * 8 + 4);
        }
      }
      else {
        wVar1 = default_drawing->num_bgelements;
        local_778 = calloc(1,(long)wVar1);
        lVar20 = (long)pcVar3->bg_feature_offset;
        lVar18 = lVar20 * 0x28 + 0x24;
        iVar5 = 0;
        for (; lVar20 < wVar1; lVar20 = lVar20 + 1) {
          if (wVar6 == *(short *)((long)pcVar3->bgelements->unichar + lVar18 + -0xc)) {
            iVar5 = iVar5 + 1;
            *(char *)((long)local_778 + lVar20) = (char)iVar5;
          }
          lVar18 = lVar18 + 0x28;
        }
        b = (code *)CONCAT71((int7)((ulong)lVar18 >> 8),wVar6 != L'^');
        if (wVar6 != L'^' && iVar5 == 0) {
          sprintf(printbuf,"Unknown targeting key %s.",local_758);
          curses_msgwin(printbuf);
        }
        else {
          local_760 = (ulong)(wVar12 + L'\x01');
          local_740 = (short *)(long)wVar12;
          local_768 = &(*display_buffer)[0].trap;
          b = (code *)local_740;
          for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
            wVar12 = L'\0';
            if (iVar5 == 0) {
              wVar12 = wVar14;
            }
            wVar1 = wVar14;
            if (iVar5 == 0) {
              wVar1 = L'\x14';
            }
            uVar21 = (ulong)wVar12;
            b = (code *)(local_768 + uVar21 * 0x3c0);
            for (uVar13 = uVar21; (long)uVar13 <= (long)wVar1; uVar13 = uVar13 + 1) {
              uVar22 = 1;
              if (uVar13 == uVar21) {
                uVar22 = local_760;
              }
              if (iVar5 != 0) {
                uVar22 = 1;
              }
              psVar15 = (short *)0x4f;
              if (uVar13 == (long)wVar1) {
                psVar15 = local_740;
              }
              psVar16 = (short *)b;
              uVar19 = uVar22;
              if (iVar5 != 1) {
                psVar15 = (short *)0x4f;
              }
              for (; (long)uVar19 <= (long)psVar15; uVar19 = uVar19 + 1) {
                if ((((long)psVar16[uVar22 * 0xc + -1] != 0) &&
                    (*(char *)((long)local_778 + (long)psVar16[uVar22 * 0xc + -1]) != '\0')) ||
                   ((wVar6 == L'^' && (psVar16[uVar22 * 0xc] != 0)))) {
                  uVar25 = uVar13 & 0xffffffff;
                  uVar24 = uVar19 & 0xffffffff;
                  goto LAB_0010c14a;
                }
                psVar16 = psVar16 + 0xc;
              }
              b = (code *)((long)b + 0x780);
            }
          }
          sprintf(printbuf,"Can\'t find dungeon feature \'%c\'.",(ulong)(uint)(int)(char)wVar6);
          curses_msgwin(printbuf);
        }
      }
    }
    else {
      psVar15 = (short *)(ulong)(uint)(1 - wVar12);
      if (iVar5 + wVar12 != 0 && SCARRY4(iVar5,wVar12) == iVar5 + wVar12 < 0) {
        psVar15 = (short *)b;
      }
      iVar5 = 0x4f - wVar12;
      if ((int)psVar15 + wVar12 < 0x50) {
        iVar5 = (int)psVar15;
      }
      uVar2 = -wVar14;
      if (-1 < uVar8 + wVar14) {
        uVar2 = uVar8;
      }
      b = (code *)(ulong)uVar2;
      uVar8 = 0x14 - wVar14;
      if (uVar2 + wVar14 < 0x15) {
        uVar8 = uVar2;
      }
      uVar25 = (ulong)(uint)(uVar8 + wVar14);
      uVar24 = (ulong)(uint)(iVar5 + wVar12);
    }
LAB_0010c14a:
    wmove(mapwin,uVar25,(int)uVar24 + -1);
    wrefresh();
    bVar4 = true;
  }
  wVar12 = L'\xfffffff6';
  wVar6 = L'\xffffffff';
  wVar14 = wVar12;
  goto LAB_0010c1c4;
}

Assistant:

int curses_getpos(int *x, int *y, nh_bool force, const char *goal)
{
    int result = 0;
    int cx, cy;
    int key, dx, dy;
    int sidx;
    static const char pick_chars[] = " \r\n.,;:";
    static const int pick_vals[] = {1, 1, 1, 1, 2, 3, 4};
    const char *cp;
    char printbuf[BUFSZ];
    char *matching = NULL;
    enum nh_direction dir;
    struct coord *monpos = NULL;
    int moncount, monidx;
    nh_bool first_move = TRUE;

    werase(statuswin);
    mvwaddstr(statuswin, 0, 0, "Select a target location with the cursor: "
			       "'.' to confirm");
    if (!force) waddstr(statuswin, ", ESC to cancel.");
    else waddstr(statuswin, ".");
    mvwaddstr(statuswin, 1, 0, "Press '?' for help and tips.");
    wrefresh(statuswin);
    
    cx = *x >= 1 ? *x : player.x;
    cy = *y >= 0 ? *y : player.y;
    wmove(mapwin, cy, cx-1);
    
    while (1) {
	if (first_move) {
	    /* Give initial message a chance to be seen. */
	    first_move = FALSE;
	} else {
	    struct nh_desc_buf descbuf;
	    int mx = 0, my = 0;

	    /* Describe what's under the cursor in the status window. */
	    nh_describe_pos(cx, cy, &descbuf);

	    werase(statuswin);
	    place_desc_message(statuswin, &mx, &my, descbuf.effectdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.invisdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.mondesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.objdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.trapdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.bgdesc);
	    wrefresh(statuswin);

	    wmove(mapwin, cy, cx-1);
	}

	dx = dy = 0;
	key = get_map_key(FALSE);
	if (key == KEY_ESC) {
	    cx = cy = -10;
	    result = -1;
	    break;
	}
	
	if ((cp = strchr(pick_chars, (char)key)) != 0) {
	    result = pick_vals[cp - pick_chars];
	    break;
	}

	dir = key_to_dir(key);
	if (dir != DIR_NONE) {
	    dx = xdir[dir];
	    dy = ydir[dir];
	} else if ( (dir = key_to_dir(tolower((unsigned char)key))) != DIR_NONE ) {
	    /* a shifted movement letter */
	    dx = xdir[dir] * 8;
	    dy = ydir[dir] * 8;
	}
	
	if (dx || dy) {
	    /* truncate at map edge */
	    if (cx + dx < 1)
		dx = 1 - cx;
	    if (cx + dx > COLNO-1)
		dx = COLNO - 1 - cx;
	    if (cy + dy < 0)
		dy = -cy;
	    if (cy + dy > ROWNO-1)
		dy = ROWNO - 1 - cy;
	    cx += dx;
	    cy += dy;
	    goto nxtc;
	}

	if (key == 'm' || key == 'M') {
	    if (!monpos) {
		int i, j;
		moncount = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y))
			    moncount++;
		monpos = malloc(moncount * sizeof(struct coord));
		monidx = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y)) {
			    monpos[monidx].x = j;
			    monpos[monidx].y = i;
			    monidx++;
			}
		qsort(monpos, moncount, sizeof(struct coord), compare_coord_dist);
		/* ready this for first increment/decrement to change to zero */
		monidx = (key == 'm') ? -1 : 1;
	    }
	    
	    if (moncount) { /* there is at least one monster to move to */
		if (key == 'm') {
		    monidx = (monidx + 1) % moncount;
		} else {
		    monidx--;
		    if (monidx < 0) monidx += moncount;
		}
		cx = monpos[monidx].x;
		cy = monpos[monidx].y;
	    }
	} else if (key == '@') {
	    cx = player.x;
	    cy = player.y;
	} else if (key == '?') {
	    static struct nh_menuitem helpitems[] = {
		{0, MI_TEXT, "Move the cursor with the direction keys:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "7 8 9   y k u"},
		{0, MI_TEXT, " \\|/     \\|/"},
		{0, MI_TEXT, "4- -6   h- -l"},
		{0, MI_TEXT, " /|\\     /|\\"},
		{0, MI_TEXT, "1 2 3   b j n"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Hold shift to move the cursor further."},
		{0, MI_TEXT, "Confirm your chosen location with one of .,;:"},
		{0, MI_TEXT, "Cancel with ESC (not always possible)."},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Targeting shortcuts:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "@    self"},
		{0, MI_TEXT, "m/M  next/previous monster"},
		{0, MI_TEXT, "<    upstairs"},
		{0, MI_TEXT, ">    downstairs"},
		{0, MI_TEXT, "_    altar"},
		{0, MI_TEXT, "#    sink"},
		{0, MI_TEXT, "     (other dungeon symbols also work)"},
	    };
	    curses_display_menu(helpitems, ARRAY_SIZE(helpitems),
				"Targeting Help (default keys)",
				PICK_NONE, NULL);
	} else {
	    int k = 0, tx, ty;
	    int pass, lo_x, lo_y, hi_x, hi_y;
	    matching = malloc(default_drawing->num_bgelements);
	    memset(matching, 0, default_drawing->num_bgelements);
	    for (sidx = default_drawing->bg_feature_offset;
		 sidx < default_drawing->num_bgelements; sidx++)
		if (key == default_drawing->bgelements[sidx].ch)
		    matching[sidx] = (char) ++k;
	    if (k || key == '^') {
		for (pass = 0; pass <= 1; pass++) {
		    /* pass 0: just past current pos to lower right;
			pass 1: upper left corner to current pos */
		    lo_y = (pass == 0) ? cy : 0;
		    hi_y = (pass == 0) ? ROWNO - 1 : cy;
		    for (ty = lo_y; ty <= hi_y; ty++) {
			lo_x = (pass == 0 && ty == lo_y) ? cx + 1 : 1;
			hi_x = (pass == 1 && ty == hi_y) ? cx : COLNO - 1;
			for (tx = lo_x; tx <= hi_x; tx++) {
			    k = display_buffer[ty][tx].bg;
			    if ((k && matching[k]) ||
				(key == '^' && display_buffer[ty][tx].trap)) {
				cx = tx;
				cy = ty;
				goto nxtc;
			    }
			}	/* column */
		    }	/* row */
		}		/* pass */
		sprintf(printbuf, "Can't find dungeon feature '%c'.", (char)key);
		curses_msgwin(printbuf);
	    } else {
		sprintf(printbuf, "Unknown targeting key %s.",
			!force ? "(ESC to abort, '?' for help)" : "('?' for help)");
		curses_msgwin(printbuf);
	    }
	}

nxtc:
	wmove(mapwin, cy, cx-1);
	wrefresh(mapwin);
    }
    
    *x = cx;
    *y = cy;
    if (monpos)
	free(monpos);
    if (matching)
	free(matching);
    curses_update_status(NULL); /* clear the help message */
    return result;
}